

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

uint __thiscall
TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>::Push
          (TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit> *this,TexInit *item)

{
  uint uVar1;
  int iVar2;
  TexInit *pTVar3;
  
  Grow(this,1);
  pTVar3 = this->Array;
  uVar1 = this->Count;
  FString::AttachToOther(&pTVar3[uVar1].TexName,&item->TexName);
  iVar2 = item->UseType;
  *(undefined4 *)((long)&pTVar3[uVar1].UseType + 3) = *(undefined4 *)((long)&item->UseType + 3);
  pTVar3[uVar1].UseType = iVar2;
  FScriptPosition::FScriptPosition(&pTVar3[uVar1].sc,&item->sc);
  uVar1 = this->Count;
  this->Count = uVar1 + 1;
  return uVar1;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}